

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O3

QString * __thiscall
QLocalSocketPrivate::generateErrorString
          (QString *__return_storage_ptr__,QLocalSocketPrivate *this,LocalSocketError error,
          QString *function)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int *piVar3;
  int iVar4;
  long in_FS_OFFSET;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QArrayData *local_78 [3];
  QArrayData *local_60 [3];
  undefined8 local_48;
  undefined8 uStack_40;
  qsizetype local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  switch(error) {
  case ConnectionRefusedError:
    iVar4 = 0x27d508;
    break;
  case PeerClosedError:
    iVar4 = 0x27d51f;
    break;
  case ServerNotFoundError:
    iVar4 = 0x27d531;
    break;
  case SocketAccessError:
    iVar4 = 0x27d542;
    break;
  case SocketResourceError:
    iVar4 = 0x27d55a;
    break;
  case SocketTimeoutError:
    iVar4 = 0x27d574;
    break;
  case DatagramTooLargeError:
    iVar4 = 0x27d593;
    break;
  case ConnectionError:
    iVar4 = 0x27d5aa;
    break;
  default:
    QMetaObject::tr((char *)local_78,(char *)&QLocalSocket::staticMetaObject,0x27d310);
    QVar5.m_size = (size_t)local_78;
    QVar5.field_0.m_data = local_60;
    QString::arg_impl(QVar5,(int)(function->d).ptr,(QChar)(char16_t)(function->d).size);
    piVar3 = __errno_location();
    QString::arg_impl((longlong)&local_48,(int)local_60,*piVar3,(QChar)0x0);
    uVar1 = (undefined4)local_48;
    uVar2 = local_48._4_4_;
    local_48 = 0;
    *(undefined4 *)&(__return_storage_ptr__->d).d = uVar1;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar2;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = (undefined4)uStack_40;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uStack_40._4_4_;
    uStack_40 = 0;
    (__return_storage_ptr__->d).size = local_38;
    local_38 = 0;
    if (local_60[0] != (QArrayData *)0x0) {
      LOCK();
      (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_60[0],2,0x10);
      }
    }
    if (local_78[0] == (QArrayData *)0x0) goto LAB_00243184;
    LOCK();
    (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar4 = (local_78[0]->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    goto joined_r0x002430b9;
  case UnsupportedSocketOperationError:
    iVar4 = 0x27d5bf;
    break;
  case OperationError:
    iVar4 = 0x27d5e9;
  }
  QMetaObject::tr((char *)local_60,(char *)&QLocalSocket::staticMetaObject,iVar4);
  QVar6.m_size = (size_t)local_60;
  QVar6.field_0.m_data = &local_48;
  QString::arg_impl(QVar6,(int)(function->d).ptr,(QChar)(char16_t)(function->d).size);
  uVar1 = (undefined4)local_48;
  uVar2 = local_48._4_4_;
  local_48 = 0;
  *(undefined4 *)&(__return_storage_ptr__->d).d = uVar1;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar2;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = (undefined4)uStack_40;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uStack_40._4_4_;
  uStack_40 = 0;
  (__return_storage_ptr__->d).size = local_38;
  local_38 = 0;
  if (local_60[0] != (QArrayData *)0x0) {
    LOCK();
    (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar4 = (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    local_78[0] = local_60[0];
joined_r0x002430b9:
    if (iVar4 == 0) {
      QArrayData::deallocate(local_78[0],2,0x10);
    }
  }
LAB_00243184:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocalSocketPrivate::generateErrorString(QLocalSocket::LocalSocketError error, const QString &function) const
{
    QString errorString;
    switch (error) {
    case QLocalSocket::ConnectionRefusedError:
        errorString = QLocalSocket::tr("%1: Connection refused").arg(function);
        break;
    case QLocalSocket::PeerClosedError:
        errorString = QLocalSocket::tr("%1: Remote closed").arg(function);
        break;
    case QLocalSocket::ServerNotFoundError:
        errorString = QLocalSocket::tr("%1: Invalid name").arg(function);
        break;
    case QLocalSocket::SocketAccessError:
        errorString = QLocalSocket::tr("%1: Socket access error").arg(function);
        break;
    case QLocalSocket::SocketResourceError:
        errorString = QLocalSocket::tr("%1: Socket resource error").arg(function);
        break;
    case QLocalSocket::SocketTimeoutError:
        errorString = QLocalSocket::tr("%1: Socket operation timed out").arg(function);
        break;
    case QLocalSocket::DatagramTooLargeError:
        errorString = QLocalSocket::tr("%1: Datagram too large").arg(function);
        break;
    case QLocalSocket::ConnectionError:
        errorString = QLocalSocket::tr("%1: Connection error").arg(function);
        break;
    case QLocalSocket::UnsupportedSocketOperationError:
        errorString = QLocalSocket::tr("%1: The socket operation is not supported").arg(function);
        break;
    case QLocalSocket::OperationError:
        errorString = QLocalSocket::tr("%1: Operation not permitted when socket is in this state").arg(function);
        break;
    case QLocalSocket::UnknownSocketError:
    default:
        errorString = QLocalSocket::tr("%1: Unknown error %2").arg(function).arg(errno);
    }
    return errorString;
}